

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O3

void e2e_async_manual_compact_test(void)

{
  time_t tVar1;
  long lVar2;
  fdb_config *pfVar3;
  undefined8 *puVar4;
  byte bVar5;
  fdb_config in_stack_fffffffffffffdf8;
  timeval __test_begin;
  fdb_config fconfig;
  
  bVar5 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  fdb_get_default_config();
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.durability_opt = '\x02';
  pfVar3 = &fconfig;
  puVar4 = (undefined8 *)&stack0xfffffffffffffdf8;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pfVar3;
    pfVar3 = (fdb_config *)((long)pfVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  e2e_async_compact_pattern(10,in_stack_fffffffffffffdf8,false,true);
  memleak_end();
  fprintf(_stderr,"%s PASSED\n","TEST: e2e async manual compact test");
  return;
}

Assistant:

void e2e_async_manual_compact_test() {
    TEST_INIT();
    memleak_start();

    randomize();
    // opts
    fdb_config fconfig = fdb_get_default_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.durability_opt = FDB_DRB_ASYNC;

    // test
    e2e_async_compact_pattern(10, fconfig, false, true);
    memleak_end();
    TEST_RESULT("TEST: e2e async manual compact test");
}